

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.c
# Opt level: O0

cn_cbor * cn_cbor_null_create(cn_cbor_errback *errp)

{
  cn_cbor *pcn;
  cn_cbor_errback *errp_local;
  
  errp_local = (cn_cbor_errback *)calloc(1,0x38);
  if (errp_local == (cn_cbor_errback *)0x0) {
    if (errp != (cn_cbor_errback *)0x0) {
      errp->err = CN_CBOR_ERR_OUT_OF_MEMORY;
    }
    errp_local = (cn_cbor_errback *)0x0;
  }
  else {
    errp_local->pos = 2;
  }
  return (cn_cbor *)errp_local;
}

Assistant:

cn_cbor * cn_cbor_null_create(CBOR_CONTEXT_COMMA cn_cbor_errback * errp)
{
	cn_cbor * pcn = CN_CALLOC(context);
	if (pcn == NULL) {
		if (errp != NULL) errp->err = CN_CBOR_ERR_OUT_OF_MEMORY;
		return NULL;
	}
	pcn->type = CN_CBOR_NULL;
	return pcn;
}